

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O2

void __thiscall
duckdb::UpdateSegment::FetchUpdates
          (UpdateSegment *this,TransactionData transaction,idx_t vector_index,Vector *result)

{
  fetch_update_function_t p_Var1;
  UpdateInfo *pUVar2;
  StorageLockKey *pSVar3;
  UndoBufferReference pin;
  undefined1 local_60 [8];
  UndoBufferPointer local_58;
  UndoBufferReference local_48;
  
  pSVar3 = (StorageLockKey *)&this->lock;
  StorageLock::GetSharedLock((StorageLock *)local_60);
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>::operator*
            ((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>
              *)local_60);
  local_58 = GetUpdateNode(this,pSVar3,vector_index);
  if (local_58.entry != (UndoBufferEntry *)0x0) {
    UndoBufferPointer::Pin(&local_48,&local_58);
    p_Var1 = this->fetch_update_function;
    pUVar2 = (UpdateInfo *)UndoBufferReference::Ptr(&local_48);
    (*p_Var1)(transaction.start_time,transaction.transaction_id,pUVar2,result);
    BufferHandle::~BufferHandle(&local_48.handle);
  }
  ::std::unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>::
  ~unique_ptr((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_> *)
              local_60);
  return;
}

Assistant:

void UpdateSegment::FetchUpdates(TransactionData transaction, idx_t vector_index, Vector &result) {
	auto lock_handle = lock.GetSharedLock();
	auto node = GetUpdateNode(*lock_handle, vector_index);
	if (!node.IsSet()) {
		return;
	}
	// FIXME: normalify if this is not the case... need to pass in count?
	D_ASSERT(result.GetVectorType() == VectorType::FLAT_VECTOR);
	auto pin = node.Pin();
	fetch_update_function(transaction.start_time, transaction.transaction_id, UpdateInfo::Get(pin), result);
}